

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O1

int nghttp2_stream_dep_remove(nghttp2_stream *stream)

{
  nghttp2_stream **ppnVar1;
  int32_t *piVar2;
  nghttp2_stream *pnVar3;
  int iVar4;
  int iVar5;
  nghttp2_stream *pnVar6;
  nghttp2_stream *pnVar7;
  int iVar8;
  
  iVar8 = -stream->weight;
  for (pnVar6 = stream->dep_next; pnVar6 != (nghttp2_stream *)0x0; pnVar6 = pnVar6->sib_next) {
    iVar4 = (stream->weight * pnVar6->weight) / stream->sum_dep_weight;
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    pnVar6->weight = iVar4;
    if ((pnVar6->queued != '\0') &&
       (iVar5 = stream_obq_move(stream->dep_prev,stream,pnVar6), iVar5 != 0)) {
      return iVar5;
    }
    iVar8 = iVar8 + iVar4;
  }
  if (stream->dep_prev == (nghttp2_stream *)0x0) {
    __assert_fail("stream->dep_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x31a,"int nghttp2_stream_dep_remove(nghttp2_stream *)");
  }
  piVar2 = &stream->dep_prev->sum_dep_weight;
  *piVar2 = *piVar2 + iVar8;
  if (stream->queued != '\0') {
    stream_obq_remove(stream);
  }
  ppnVar1 = &stream->dep_prev;
  pnVar6 = stream->sib_prev;
  if (pnVar6 == (nghttp2_stream *)0x0) {
    pnVar6 = stream->dep_prev;
    if (pnVar6 == (nghttp2_stream *)0x0) {
      __assert_fail("prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                    ,0x2d1,"void unlink_dep(nghttp2_stream *)");
    }
    pnVar3 = stream->dep_next;
    if (pnVar3 == (nghttp2_stream *)0x0) {
      pnVar3 = stream->sib_next;
      if (pnVar3 == (nghttp2_stream *)0x0) {
        pnVar6->dep_next = (nghttp2_stream *)0x0;
      }
      else {
        pnVar3->sib_prev = (nghttp2_stream *)0x0;
        pnVar6->dep_next = pnVar3;
        pnVar3->dep_prev = pnVar6;
      }
      goto LAB_0060d68e;
    }
    pnVar6->dep_next = pnVar3;
    pnVar3->dep_prev = pnVar6;
    pnVar6 = *ppnVar1;
    pnVar7 = pnVar3;
    do {
      pnVar7->dep_prev = pnVar6;
      pnVar7 = pnVar7->sib_next;
    } while (pnVar7 != (nghttp2_stream *)0x0);
    pnVar6 = stream->sib_next;
    if (pnVar6 == (nghttp2_stream *)0x0) goto LAB_0060d68e;
    do {
      pnVar7 = pnVar3;
      pnVar3 = pnVar7->sib_next;
    } while (pnVar7->sib_next != (nghttp2_stream *)0x0);
  }
  else {
    pnVar3 = stream->dep_next;
    if (pnVar3 == (nghttp2_stream *)0x0) {
      pnVar3 = stream->sib_next;
      pnVar6->sib_next = pnVar3;
      if (pnVar3 != (nghttp2_stream *)0x0) {
        pnVar3->sib_prev = pnVar6;
      }
      goto LAB_0060d68e;
    }
    pnVar6->sib_next = pnVar3;
    pnVar3->sib_prev = pnVar6;
    pnVar6 = *ppnVar1;
    pnVar7 = pnVar3;
    do {
      pnVar7->dep_prev = pnVar6;
      pnVar7 = pnVar7->sib_next;
    } while (pnVar7 != (nghttp2_stream *)0x0);
    pnVar6 = stream->sib_next;
    if (pnVar6 == (nghttp2_stream *)0x0) goto LAB_0060d68e;
    do {
      pnVar7 = pnVar3;
      pnVar3 = pnVar7->sib_next;
    } while (pnVar7->sib_next != (nghttp2_stream *)0x0);
  }
  pnVar7->sib_next = pnVar6;
  pnVar6->sib_prev = pnVar7;
LAB_0060d68e:
  stream->sum_dep_weight = 0;
  stream->sib_prev = (nghttp2_stream *)0x0;
  stream->sib_next = (nghttp2_stream *)0x0;
  *ppnVar1 = (nghttp2_stream *)0x0;
  stream->dep_next = (nghttp2_stream *)0x0;
  return 0;
}

Assistant:

int nghttp2_stream_dep_remove(nghttp2_stream *stream) {
  nghttp2_stream *dep_prev, *si;
  int32_t sum_dep_weight_delta;
  int rv;

  DEBUGF("stream: dep_remove stream(%p)=%d\n", stream, stream->stream_id);

  /* Distribute weight of |stream| to direct descendants */
  sum_dep_weight_delta = -stream->weight;

  for (si = stream->dep_next; si; si = si->sib_next) {
    si->weight = nghttp2_stream_dep_distributed_weight(stream, si->weight);

    sum_dep_weight_delta += si->weight;

    if (si->queued) {
      rv = stream_obq_move(stream->dep_prev, stream, si);
      if (rv != 0) {
        return rv;
      }
    }
  }

  assert(stream->dep_prev);

  dep_prev = stream->dep_prev;

  dep_prev->sum_dep_weight += sum_dep_weight_delta;

  if (stream->queued) {
    stream_obq_remove(stream);
  }

  if (stream->sib_prev) {
    unlink_sib(stream);
  } else {
    unlink_dep(stream);
  }

  stream->sum_dep_weight = 0;

  stream->dep_prev = NULL;
  stream->dep_next = NULL;
  stream->sib_prev = NULL;
  stream->sib_next = NULL;

  validate_tree(dep_prev);

  return 0;
}